

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O3

void jpeg_fdct_14x14(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  JSAMPROW pJVar8;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  DCTELEM workspace [48];
  int *local_170;
  int local_f8 [8];
  int aiStack_d8 [8];
  int aiStack_b8 [8];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  uVar9 = (ulong)start_col;
  lVar13 = 0;
  local_170 = data;
  do {
    pJVar8 = sample_data[lVar13];
    uVar17 = (ulong)((uint)pJVar8[uVar9] + (uint)pJVar8[uVar9 + 0xd]);
    uVar26 = (ulong)((uint)pJVar8[uVar9 + 1] + (uint)pJVar8[uVar9 + 0xc]);
    uVar14 = (ulong)((uint)pJVar8[uVar9 + 5] + (uint)pJVar8[uVar9 + 8]);
    uVar19 = (ulong)((uint)pJVar8[uVar9 + 6] + (uint)pJVar8[uVar9 + 7]);
    lVar12 = uVar19 + uVar17;
    lVar18 = uVar17 - uVar19;
    lVar15 = uVar14 + uVar26;
    lVar27 = uVar26 - uVar14;
    uVar17 = (ulong)((uint)pJVar8[uVar9 + 2] + (uint)pJVar8[uVar9 + 0xb]);
    uVar14 = (ulong)((uint)pJVar8[uVar9 + 4] + (uint)pJVar8[uVar9 + 9]);
    lVar22 = uVar14 + uVar17;
    lVar23 = uVar17 - uVar14;
    lVar28 = (ulong)pJVar8[uVar9] - (ulong)pJVar8[uVar9 + 0xd];
    lVar16 = (ulong)pJVar8[uVar9 + 1] - (ulong)pJVar8[uVar9 + 0xc];
    lVar20 = (ulong)pJVar8[uVar9 + 2] - (ulong)pJVar8[uVar9 + 0xb];
    iVar29 = (uint)pJVar8[uVar9 + 3] + (uint)pJVar8[uVar9 + 10];
    lVar24 = (ulong)pJVar8[uVar9 + 3] - (ulong)pJVar8[uVar9 + 10];
    lVar21 = (ulong)pJVar8[uVar9 + 4] - (ulong)pJVar8[uVar9 + 9];
    lVar25 = (ulong)pJVar8[uVar9 + 5] - (ulong)pJVar8[uVar9 + 8];
    lVar10 = (ulong)pJVar8[uVar9 + 6] - (ulong)pJVar8[uVar9 + 7];
    *local_170 = (int)lVar22 + (int)lVar15 + (int)lVar12 + iVar29 + -0x700;
    local_170[4] = (int)(lVar12 * 0x28c6 + (ulong)(uint)(iVar29 * 2) * -0x2000000016a1 + 0x1000 +
                         lVar22 * 0x1fffffffe3c9 + lVar15 * 0xa12 >> 0xd);
    lVar12 = (lVar27 + lVar18) * 0x2362;
    local_170[2] = (int)((ulong)(lVar23 * 0x13a3 + lVar12 + 0x1000 + lVar18 * 0x8bd) >> 0xd);
    local_170[6] = (int)((ulong)(lVar12 + lVar23 * 0x1fffffffd3e1 + 0x1000 + lVar27 * 0x1fffffffc8fc
                                ) >> 0xd);
    local_170[7] = ((int)lVar28 + (int)lVar24) -
                   ((int)(lVar20 + lVar16) + (int)(lVar25 - lVar21) + (int)lVar10);
    lVar12 = (lVar25 - lVar21) * 0x2cf8 + lVar24 * -0x2000 + (lVar20 + lVar16) * -0x511;
    lVar15 = (lVar10 + lVar21) * 0x1814 + (lVar20 + lVar28) * 0x2652;
    local_170[5] = (int)((ulong)(lVar21 * 0x23d7 + lVar15 +
                                lVar20 * 0x1fffffffb409 + lVar12 + 0x1000) >> 0xd);
    lVar22 = (lVar25 - lVar10) * 0xef2 + (lVar16 + lVar28) * 0x2ab7;
    local_170[3] = (int)((ulong)(lVar25 * 0x1fffffff9dc4 + lVar22 +
                                lVar12 + lVar16 * 0x1ffffffff26e + 0x1000) >> 0xd);
    local_170[1] = (int)((ulong)(lVar15 + 0x1000 +
                                lVar24 * 0x2000 + lVar10 * 0x1fffffffdbf1 + lVar28 * 0x1fffffffdbf0
                                + lVar22) >> 0xd);
    piVar11 = local_f8;
    if ((int)lVar13 != 7) {
      if ((int)lVar13 == 0xd) {
        lVar13 = 0;
        do {
          iVar29 = aiStack_58[lVar13];
          iVar1 = data[lVar13];
          lVar24 = (long)(iVar29 + iVar1);
          iVar2 = aiStack_78[lVar13];
          lVar16 = (long)(iVar2 + data[lVar13 + 8]);
          iVar3 = aiStack_98[lVar13];
          iVar4 = local_f8[lVar13];
          lVar22 = (long)(iVar4 + data[lVar13 + 0x28]);
          lVar15 = (long)(data[lVar13 + 0x38] + data[lVar13 + 0x30]);
          lVar12 = lVar15 + lVar24;
          lVar24 = lVar24 - lVar15;
          lVar15 = lVar22 + lVar16;
          lVar16 = lVar16 - lVar22;
          lVar20 = (long)(iVar3 + data[lVar13 + 0x10]);
          iVar5 = data[lVar13 + 0x20];
          iVar6 = aiStack_d8[lVar13];
          lVar10 = (long)(iVar6 + iVar5);
          lVar22 = lVar10 + lVar20;
          lVar20 = lVar20 - lVar10;
          iVar7 = aiStack_b8[lVar13];
          lVar10 = (long)(iVar7 + data[lVar13 + 0x18]);
          data[lVar13] = (DCTELEM)((lVar15 + lVar12 + lVar22 + lVar10) * 0x14e6 + 0x2000U >> 0xe);
          data[lVar13 + 0x20] =
               (DCTELEM)((ulong)(lVar12 * 0x1aa1 + lVar10 * -0x800000001d90 + 0x2000 +
                                lVar22 * 0x3fffffffed93 + lVar15 * 0x694) >> 0xe);
          lVar18 = (lVar24 + lVar16) * 0x171b;
          lVar12 = (long)(iVar1 - iVar29);
          lVar25 = (long)(data[lVar13 + 8] - iVar2);
          lVar15 = (long)(data[lVar13 + 0x10] - iVar3);
          lVar10 = (long)(data[lVar13 + 0x18] - iVar7);
          lVar21 = (long)(iVar5 - iVar6);
          lVar23 = (long)(data[lVar13 + 0x28] - iVar4);
          lVar22 = (long)(data[lVar13 + 0x30] - data[lVar13 + 0x38]);
          data[lVar13 + 0x10] =
               (DCTELEM)((ulong)(lVar18 + lVar20 * 0xcd3 + 0x2000 + lVar24 * 0x5b5) >> 0xe);
          data[lVar13 + 0x30] =
               (DCTELEM)((ulong)(lVar18 + lVar20 * 0x3fffffffe330 + 0x2000 + lVar16 * 0x3fffffffdc12
                                ) >> 0xe);
          data[lVar13 + 0x38] =
               (DCTELEM)(((lVar12 + lVar10) - (lVar15 + lVar25 + (lVar23 - lVar21) + lVar22)) *
                         0x14e6 + 0x2000U >> 0xe);
          lVar18 = (lVar23 - lVar21) * 0x1d5e + lVar10 * -0x14e6 + (lVar15 + lVar25) * -0x34f;
          lVar16 = (lVar22 + lVar21) * 0xfb9 + (lVar15 + lVar12) * 0x1906;
          data[lVar13 + 0x28] =
               (DCTELEM)((ulong)(lVar21 * 0x1768 + lVar16 +
                                lVar15 * 0x3fffffffce64 + lVar18 + 0x2000) >> 0xe);
          lVar15 = (lVar23 - lVar22) * 0x9c3 + (lVar12 + lVar25) * 0x1be5;
          data[lVar13 + 0x18] =
               (DCTELEM)((ulong)(lVar23 * 0x3fffffffbfd9 + lVar15 +
                                lVar18 + lVar25 * 0x3ffffffff723 + 0x2000) >> 0xe);
          data[lVar13 + 8] =
               (DCTELEM)((ulong)(lVar16 + 0x2000 +
                                lVar12 * 0x3fffffffe873 + lVar10 * 0x14e6 + lVar22 * 0x3ffffffffd59
                                + lVar15) >> 0xe);
          lVar13 = lVar13 + 1;
        } while ((int)lVar13 != 8);
        return;
      }
      piVar11 = local_170 + 8;
    }
    lVar13 = lVar13 + 1;
    local_170 = piVar11;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_14x14 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16;
  DCTELEM workspace[8*6];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */
  /* cK represents sqrt(2) * cos(K*pi/28). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[13]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[12]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[11]);
    tmp13 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[10]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[9]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[8]);
    tmp6 = GETJSAMPLE(elemptr[6]) + GETJSAMPLE(elemptr[7]);

    tmp10 = tmp0 + tmp6;
    tmp14 = tmp0 - tmp6;
    tmp11 = tmp1 + tmp5;
    tmp15 = tmp1 - tmp5;
    tmp12 = tmp2 + tmp4;
    tmp16 = tmp2 - tmp4;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[13]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[12]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[11]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[10]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[9]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[8]);
    tmp6 = GETJSAMPLE(elemptr[6]) - GETJSAMPLE(elemptr[7]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      (tmp10 + tmp11 + tmp12 + tmp13 - 14 * CENTERJSAMPLE);
    tmp13 += tmp13;
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.274162392)) + /* c4 */
	      MULTIPLY(tmp11 - tmp13, FIX(0.314692123)) - /* c12 */
	      MULTIPLY(tmp12 - tmp13, FIX(0.881747734)),  /* c8 */
	      CONST_BITS);

    tmp10 = MULTIPLY(tmp14 + tmp15, FIX(1.105676686));    /* c6 */

    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp14, FIX(0.273079590))   /* c2-c6 */
	      + MULTIPLY(tmp16, FIX(0.613604268)),        /* c10 */
	      CONST_BITS);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp15, FIX(1.719280954))   /* c6+c10 */
	      - MULTIPLY(tmp16, FIX(1.378756276)),        /* c2 */
	      CONST_BITS);

    /* Odd part */

    tmp10 = tmp1 + tmp2;
    tmp11 = tmp5 - tmp4;
    dataptr[7] = (DCTELEM) (tmp0 - tmp10 + tmp3 - tmp11 - tmp6);
    tmp3 <<= CONST_BITS;
    tmp10 = MULTIPLY(tmp10, - FIX(0.158341681));          /* -c13 */
    tmp11 = MULTIPLY(tmp11, FIX(1.405321284));            /* c1 */
    tmp10 += tmp11 - tmp3;
    tmp11 = MULTIPLY(tmp0 + tmp2, FIX(1.197448846)) +     /* c5 */
	    MULTIPLY(tmp4 + tmp6, FIX(0.752406978));      /* c9 */
    dataptr[5] = (DCTELEM)
      DESCALE(tmp10 + tmp11 - MULTIPLY(tmp2, FIX(2.373959773)) /* c3+c5-c13 */
	      + MULTIPLY(tmp4, FIX(1.119999435)),         /* c1+c11-c9 */
	      CONST_BITS);
    tmp12 = MULTIPLY(tmp0 + tmp1, FIX(1.334852607)) +     /* c3 */
	    MULTIPLY(tmp5 - tmp6, FIX(0.467085129));      /* c11 */
    dataptr[3] = (DCTELEM)
      DESCALE(tmp10 + tmp12 - MULTIPLY(tmp1, FIX(0.424103948)) /* c3-c9-c13 */
	      - MULTIPLY(tmp5, FIX(3.069855259)),         /* c1+c5+c11 */
	      CONST_BITS);
    dataptr[1] = (DCTELEM)
      DESCALE(tmp11 + tmp12 + tmp3 + tmp6 -
	      MULTIPLY(tmp0 + tmp6, FIX(1.126980169)),    /* c3+c5-c1 */
	      CONST_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 14)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/14)**2 = 16/49, which we partially
   * fold into the constant multipliers and final shifting:
   * cK now represents sqrt(2) * cos(K*pi/28) * 32/49.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*3];
    tmp13 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*2];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*1];
    tmp5 = dataptr[DCTSIZE*5] + wsptr[DCTSIZE*0];
    tmp6 = dataptr[DCTSIZE*6] + dataptr[DCTSIZE*7];

    tmp10 = tmp0 + tmp6;
    tmp14 = tmp0 - tmp6;
    tmp11 = tmp1 + tmp5;
    tmp15 = tmp1 - tmp5;
    tmp12 = tmp2 + tmp4;
    tmp16 = tmp2 - tmp4;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*3];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*2];
    tmp4 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*1];
    tmp5 = dataptr[DCTSIZE*5] - wsptr[DCTSIZE*0];
    tmp6 = dataptr[DCTSIZE*6] - dataptr[DCTSIZE*7];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11 + tmp12 + tmp13,
		       FIX(0.653061224)),                 /* 32/49 */
	      CONST_BITS+1);
    tmp13 += tmp13;
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(0.832106052)) + /* c4 */
	      MULTIPLY(tmp11 - tmp13, FIX(0.205513223)) - /* c12 */
	      MULTIPLY(tmp12 - tmp13, FIX(0.575835255)),  /* c8 */
	      CONST_BITS+1);

    tmp10 = MULTIPLY(tmp14 + tmp15, FIX(0.722074570));    /* c6 */

    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp14, FIX(0.178337691))   /* c2-c6 */
	      + MULTIPLY(tmp16, FIX(0.400721155)),        /* c10 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp15, FIX(1.122795725))   /* c6+c10 */
	      - MULTIPLY(tmp16, FIX(0.900412262)),        /* c2 */
	      CONST_BITS+1);

    /* Odd part */

    tmp10 = tmp1 + tmp2;
    tmp11 = tmp5 - tmp4;
    dataptr[DCTSIZE*7] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp10 + tmp3 - tmp11 - tmp6,
		       FIX(0.653061224)),                 /* 32/49 */
	      CONST_BITS+1);
    tmp3  = MULTIPLY(tmp3 , FIX(0.653061224));            /* 32/49 */
    tmp10 = MULTIPLY(tmp10, - FIX(0.103406812));          /* -c13 */
    tmp11 = MULTIPLY(tmp11, FIX(0.917760839));            /* c1 */
    tmp10 += tmp11 - tmp3;
    tmp11 = MULTIPLY(tmp0 + tmp2, FIX(0.782007410)) +     /* c5 */
	    MULTIPLY(tmp4 + tmp6, FIX(0.491367823));      /* c9 */
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(tmp10 + tmp11 - MULTIPLY(tmp2, FIX(1.550341076)) /* c3+c5-c13 */
	      + MULTIPLY(tmp4, FIX(0.731428202)),         /* c1+c11-c9 */
	      CONST_BITS+1);
    tmp12 = MULTIPLY(tmp0 + tmp1, FIX(0.871740478)) +     /* c3 */
	    MULTIPLY(tmp5 - tmp6, FIX(0.305035186));      /* c11 */
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(tmp10 + tmp12 - MULTIPLY(tmp1, FIX(0.276965844)) /* c3-c9-c13 */
	      - MULTIPLY(tmp5, FIX(2.004803435)),         /* c1+c5+c11 */
	      CONST_BITS+1);
    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp11 + tmp12 + tmp3
	      - MULTIPLY(tmp0, FIX(0.735987049))          /* c3+c5-c1 */
	      - MULTIPLY(tmp6, FIX(0.082925825)),         /* c9-c11-c13 */
	      CONST_BITS+1);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}